

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  int iVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  byte bVar4;
  bool bVar5;
  ImGuiWindow *pIVar6;
  byte *in_RCX;
  byte *in_RDX;
  ImGuiID in_ESI;
  uint in_R8D;
  ImVec2 IVar7;
  bool is_repeating_already;
  bool is_double_click_release;
  bool release_anywhere;
  bool release_in;
  int mouse_button;
  bool held;
  bool nav_activated_by_inputs;
  bool nav_activated_by_code;
  bool has_repeated_at_least_once;
  int mouse_button_released;
  int mouse_button_clicked;
  bool hovered;
  bool pressed;
  bool flatten_hovered_children;
  ImGuiWindow *backup_hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 uVar8;
  ImGuiWindow *in_stack_ffffffffffffffa8;
  ImGuiMouseButton in_stack_ffffffffffffffb0;
  uint uVar9;
  ImGuiID in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffbd;
  byte bVar10;
  byte bVar11;
  ImGuiWindow *window_00;
  ImGuiID id_00;
  uint local_24;
  
  pIVar3 = GImGui;
  pIVar6 = GetCurrentWindow();
  local_24 = in_R8D;
  if ((in_R8D & 7) == 0) {
    local_24 = in_R8D | 1;
  }
  if ((local_24 & 0x3f0) == 0) {
    local_24 = local_24 | 0x20;
  }
  window_00 = pIVar3->HoveredWindow;
  uVar8 = false;
  if (((local_24 & 0x800) != 0) && (uVar8 = false, pIVar3->HoveredWindow != (ImGuiWindow *)0x0)) {
    uVar8 = pIVar3->HoveredWindow->RootWindow == pIVar6;
  }
  if ((bool)uVar8 != false) {
    pIVar3->HoveredWindow = pIVar6;
  }
  bVar10 = 0;
  bVar11 = uVar8;
  bVar4 = ItemHoverable((ImRect *)
                        CONCAT17(uVar8,(uint7)CONCAT15(in_stack_ffffffffffffffbd,
                                                       CONCAT14(in_stack_ffffffffffffffbc,
                                                                in_stack_ffffffffffffffb8))),
                        in_stack_ffffffffffffffb4);
  if (((((bool)bVar4) && ((pIVar3->DragDropActive & 1U) != 0)) &&
      ((pIVar3->DragDropPayload).SourceId == in_ESI)) && ((pIVar3->DragDropSourceFlags & 2U) == 0))
  {
    bVar4 = false;
  }
  if ((((pIVar3->DragDropActive & 1U) != 0) && ((local_24 & 0x200) != 0)) &&
     (((pIVar3->DragDropSourceFlags & 4U) == 0 &&
      (bVar5 = IsItemHovered(in_stack_ffffffffffffffb0), bVar5)))) {
    bVar4 = 1;
    SetHoveredID(in_ESI);
    if ((pIVar3->HoveredIdTimer - (pIVar3->IO).DeltaTime <= 0.7) && (0.7 <= pIVar3->HoveredIdTimer))
    {
      bVar10 = 1;
      pIVar3->DragDropHoldJustPressedId = in_ESI;
      FocusWindow(window_00);
    }
  }
  if ((bVar11 & 1) != 0) {
    pIVar3->HoveredWindow = window_00;
  }
  if (((((bVar4 & 1) != 0) && ((local_24 & 0x1000) != 0)) &&
      (pIVar3->HoveredIdPreviousFrame != in_ESI)) && (pIVar3->HoveredIdPreviousFrame != 0)) {
    bVar4 = 0;
  }
  if ((bVar4 & 1) != 0) {
    if (((local_24 & 0x10000) == 0) ||
       (((((pIVar3->IO).KeyCtrl & 1U) == 0 && (((pIVar3->IO).KeyShift & 1U) == 0)) &&
        (((pIVar3->IO).KeyAlt & 1U) == 0)))) {
      in_stack_ffffffffffffffb8 = -1;
      in_stack_ffffffffffffffb4 = 0xffffffff;
      if (((local_24 & 1) == 0) || (((pIVar3->IO).MouseClicked[0] & 1U) == 0)) {
        if (((local_24 & 2) == 0) || (((pIVar3->IO).MouseClicked[1] & 1U) == 0)) {
          if (((local_24 & 4) != 0) && (((pIVar3->IO).MouseClicked[2] & 1U) != 0)) {
            in_stack_ffffffffffffffb8 = 2;
          }
        }
        else {
          in_stack_ffffffffffffffb8 = 1;
        }
      }
      else {
        in_stack_ffffffffffffffb8 = 0;
      }
      if (((local_24 & 1) == 0) || (((pIVar3->IO).MouseReleased[0] & 1U) == 0)) {
        if (((local_24 & 2) == 0) || (((pIVar3->IO).MouseReleased[1] & 1U) == 0)) {
          if (((local_24 & 4) != 0) && (((pIVar3->IO).MouseReleased[2] & 1U) != 0)) {
            in_stack_ffffffffffffffb4 = 2;
          }
        }
        else {
          in_stack_ffffffffffffffb4 = 1;
        }
      }
      else {
        in_stack_ffffffffffffffb4 = 0;
      }
      if ((in_stack_ffffffffffffffb8 != -1) && (pIVar3->ActiveId != in_ESI)) {
        if ((local_24 & 0x60) != 0) {
          SetActiveID(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
          pIVar3->ActiveIdMouseButton = in_stack_ffffffffffffffb8;
          if ((local_24 & 0x40000) == 0) {
            SetFocusID((ImGuiID)((ulong)window_00 >> 0x20),
                       (ImGuiWindow *)
                       CONCAT17(bVar11,CONCAT16(bVar10,CONCAT15(bVar4,CONCAT14(
                                                  in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8)))));
          }
          FocusWindow(window_00);
        }
        if (((local_24 & 0x10) != 0) ||
           (((local_24 & 0x100) != 0 &&
            ((pIVar3->IO).MouseClickedCount[in_stack_ffffffffffffffb8] == 2)))) {
          bVar10 = 1;
          if ((local_24 & 0x20000) == 0) {
            SetActiveID(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
          }
          else {
            ClearActiveID();
          }
          if ((local_24 & 0x40000) == 0) {
            SetFocusID((ImGuiID)((ulong)window_00 >> 0x20),
                       (ImGuiWindow *)
                       CONCAT17(bVar11,CONCAT16(bVar10,CONCAT15(bVar4,CONCAT14(
                                                  in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8)))));
          }
          pIVar3->ActiveIdMouseButton = in_stack_ffffffffffffffb8;
          FocusWindow(window_00);
        }
      }
      if (((local_24 & 0x80) != 0) && (in_stack_ffffffffffffffb4 != 0xffffffff)) {
        in_stack_ffffffffffffff9e = false;
        if ((local_24 & 0x400) != 0) {
          in_stack_ffffffffffffff9e =
               (pIVar3->IO).KeyRepeatDelay <=
               (pIVar3->IO).MouseDownDurationPrev[(int)in_stack_ffffffffffffffb4];
        }
        in_stack_ffffffffffffffb0 =
             CONCAT13(in_stack_ffffffffffffff9e,(int3)in_stack_ffffffffffffffb0);
        if ((bool)in_stack_ffffffffffffff9e == false) {
          bVar10 = 1;
        }
        if ((local_24 & 0x40000) == 0) {
          SetFocusID((ImGuiID)((ulong)window_00 >> 0x20),
                     (ImGuiWindow *)
                     CONCAT17(bVar11,CONCAT16(bVar10,CONCAT15(bVar4,CONCAT14(
                                                  in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8)))));
        }
        ClearActiveID();
      }
      if ((((pIVar3->ActiveId == in_ESI) && ((local_24 & 0x400) != 0)) &&
          (0.0 < (pIVar3->IO).MouseDownDuration[pIVar3->ActiveIdMouseButton])) &&
         (bVar5 = IsMouseClicked(in_stack_ffffffffffffffb0,
                                 SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0)), bVar5)) {
        bVar10 = 1;
      }
    }
    if ((bVar10 & 1) != 0) {
      pIVar3->NavDisableHighlight = true;
    }
  }
  id_00 = (ImGuiID)((ulong)window_00 >> 0x20);
  if (((((pIVar3->NavId == in_ESI) && ((pIVar3->NavDisableHighlight & 1U) == 0)) &&
       ((pIVar3->NavDisableMouseHover & 1U) != 0)) &&
      (((pIVar3->ActiveId == 0 || (pIVar3->ActiveId == in_ESI)) ||
       (pIVar3->ActiveId == pIVar6->MoveId)))) && ((local_24 & 0x80000) == 0)) {
    bVar4 = 1;
  }
  if (pIVar3->NavActivateDownId == in_ESI) {
    uVar9 = (uint)(pIVar3->NavActivateId == in_ESI) << 0x10;
    bVar5 = IsNavInputTest(0,0x196b1a);
    if (((uVar9 & 0x10000) != 0) || (bVar5)) {
      bVar10 = 1;
      SetActiveID(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
      pIVar3->ActiveIdSource = ImGuiInputSource_Nav;
      if ((local_24 & 0x40000) == 0) {
        SetFocusID(id_00,(ImGuiWindow *)
                         CONCAT17(bVar11,CONCAT16(bVar10,CONCAT15(bVar4,CONCAT14(
                                                  in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8)))));
      }
    }
  }
  bVar11 = 0;
  if (pIVar3->ActiveId == in_ESI) {
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      bVar11 = 0;
      if ((pIVar3->ActiveIdIsJustActivated & 1U) != 0) {
        bVar11 = 0;
        IVar7 = operator-((ImVec2 *)
                          CONCAT17(uVar8,CONCAT16(in_stack_ffffffffffffff9e,
                                                  CONCAT15(in_stack_ffffffffffffff9d,
                                                           CONCAT14(in_stack_ffffffffffffff9c,
                                                                    in_stack_ffffffffffffff98)))),
                          (ImVec2 *)0x196bc0);
        pIVar3->ActiveIdClickOffset = IVar7;
      }
      iVar1 = pIVar3->ActiveIdMouseButton;
      if (((pIVar3->IO).MouseDown[iVar1] & 1U) == 0) {
        if ((((bVar4 & 1) != 0 && (local_24 & 0x20) != 0) || ((local_24 & 0x40) != 0)) &&
           ((pIVar3->DragDropActive & 1U) == 0)) {
          bVar5 = false;
          if (((local_24 & 0x100) != 0) &&
             (bVar5 = false, ((pIVar3->IO).MouseReleased[iVar1] & 1U) != 0)) {
            bVar5 = (pIVar3->IO).MouseClickedLastCount[iVar1] == 2;
          }
          bVar2 = false;
          if ((local_24 & 0x400) != 0) {
            bVar2 = (pIVar3->IO).KeyRepeatDelay <= (pIVar3->IO).MouseDownDurationPrev[iVar1];
          }
          if ((!bVar5) && (!bVar2)) {
            bVar10 = 1;
          }
        }
        ClearActiveID();
      }
      else {
        bVar11 = 1;
      }
      if ((local_24 & 0x40000) == 0) {
        pIVar3->NavDisableHighlight = true;
      }
    }
    else {
      bVar11 = 0;
      if ((pIVar3->ActiveIdSource == ImGuiInputSource_Nav) &&
         (bVar11 = 0, pIVar3->NavActivateDownId != in_ESI)) {
        bVar11 = 0;
        ClearActiveID();
      }
    }
    if ((bVar10 & 1) != 0) {
      pIVar3->ActiveIdHasBeenPressedBefore = true;
    }
  }
  if (in_RDX != (byte *)0x0) {
    *in_RDX = bVar4 & 1;
  }
  if (in_RCX != (byte *)0x0) {
    *in_RCX = bVar11 & 1;
  }
  return (bool)(bVar10 & 1);
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Default only reacts to left mouse button
    if ((flags & ImGuiButtonFlags_MouseButtonMask_) == 0)
        flags |= ImGuiButtonFlags_MouseButtonDefault_;

    // Default behavior requires click + release inside bounding box
    if ((flags & ImGuiButtonFlags_PressedOnMask_) == 0)
        flags |= ImGuiButtonFlags_PressedOnDefault_;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredWindow && g.HoveredWindow->RootWindow == window;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && g.LastItemData.ID != id)
        IMGUI_TEST_ENGINE_ITEM_ADD(bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (g.HoveredIdTimer - g.IO.DeltaTime <= DRAGDROP_HOLD_TO_OPEN_TIMER && g.HoveredIdTimer >= DRAGDROP_HOLD_TO_OPEN_TIMER)
            {
                pressed = true;
                g.DragDropHoldJustPressedId = id;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse handling
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            // Poll buttons
            int mouse_button_clicked = -1;
            int mouse_button_released = -1;
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseClicked[0])         { mouse_button_clicked = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseClicked[1])   { mouse_button_clicked = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseClicked[2])  { mouse_button_clicked = 2; }
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseReleased[0])        { mouse_button_released = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseReleased[1])  { mouse_button_released = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseReleased[2]) { mouse_button_released = 2; }

            if (mouse_button_clicked != -1 && g.ActiveId != id)
            {
                if (flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClickReleaseAnywhere))
                {
                    SetActiveID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    FocusWindow(window);
                }
                if ((flags & ImGuiButtonFlags_PressedOnClick) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseClickedCount[mouse_button_clicked] == 2))
                {
                    pressed = true;
                    if (flags & ImGuiButtonFlags_NoHoldingActiveId)
                        ClearActiveID();
                    else
                        SetActiveID(id, window); // Hold on ID
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    FocusWindow(window);
                }
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && mouse_button_released != -1)
            {
                // Repeat mode trumps on release behavior
                const bool has_repeated_at_least_once = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button_released] >= g.IO.KeyRepeatDelay;
                if (!has_repeated_at_least_once)
                    pressed = true;
                if (!(flags & ImGuiButtonFlags_NoNavFocus))
                    SetFocusID(id, window);
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if (g.ActiveId == id && (flags & ImGuiButtonFlags_Repeat))
                if (g.IO.MouseDownDuration[g.ActiveIdMouseButton] > 0.0f && IsMouseClicked(g.ActiveIdMouseButton, true))
                    pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnFocus))
            hovered = true;
    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputTest(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            pressed = true;
            SetActiveID(id, window);
            g.ActiveIdSource = ImGuiInputSource_Nav;
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    // Process while held
    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;

            const int mouse_button = g.ActiveIdMouseButton;
            IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
            if (g.IO.MouseDown[mouse_button])
            {
                held = true;
            }
            else
            {
                bool release_in = hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) != 0;
                bool release_anywhere = (flags & ImGuiButtonFlags_PressedOnClickReleaseAnywhere) != 0;
                if ((release_in || release_anywhere) && !g.DragDropActive)
                {
                    // Report as pressed when releasing the mouse (this is the most common path)
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseReleased[mouse_button] && g.IO.MouseClickedLastCount[mouse_button] == 2;
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    if (!is_double_click_release && !is_repeating_already)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            // When activated using Nav, we hold on the ActiveID until activation button is released
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}